

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPController.cpp
# Opt level: O1

int __thiscall TCPController::poll(TCPController *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  ushort uVar1;
  ulong uVar2;
  __node_base_ptr p_Var3;
  _Hash_node_base *p_Var4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar6;
  __node_base_ptr p_Var7;
  mapped_type *pmVar8;
  ulong uVar9;
  __node_base_ptr p_Var10;
  nfds_t nVar11;
  bool bVar12;
  pollfd pfd;
  pollfd local_48;
  pollfd *local_40;
  _Map_base<int,_std::pair<const_int,_std::shared_ptr<TCPConnection>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<TCPConnection>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_38;
  
  local_38 = (_Map_base<int,_std::pair<const_int,_std::shared_ptr<TCPConnection>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<TCPConnection>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)&this->connections;
  iVar6 = 0;
  local_40 = __fds;
  do {
    if (__nfds != 0) {
      nVar11 = 0;
      do {
        local_48 = local_40[nVar11];
        std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
        uVar2 = (this->connections)._M_h._M_bucket_count;
        uVar9 = (ulong)(long)local_48.fd % uVar2;
        p_Var3 = (this->connections)._M_h._M_buckets[uVar9];
        p_Var7 = (__node_base_ptr)0x0;
        if ((p_Var3 != (__node_base_ptr)0x0) &&
           (p_Var7 = p_Var3, p_Var10 = p_Var3->_M_nxt,
           local_48.fd != *(int *)&p_Var3->_M_nxt[1]._M_nxt)) {
          while (p_Var4 = p_Var10->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
            p_Var7 = (__node_base_ptr)0x0;
            if (((ulong)(long)*(int *)&p_Var4[1]._M_nxt % uVar2 != uVar9) ||
               (p_Var7 = p_Var10, p_Var10 = p_Var4, local_48.fd == *(int *)&p_Var4[1]._M_nxt))
            goto LAB_00108af9;
          }
          p_Var7 = (__node_base_ptr)0x0;
        }
LAB_00108af9:
        if (p_Var7 == (__node_base_ptr)0x0) {
          bVar12 = true;
        }
        else {
          bVar12 = p_Var7->_M_nxt == (_Hash_node_base *)0x0;
        }
        if (!bVar12) {
          pmVar8 = std::__detail::
                   _Map_base<int,_std::pair<const_int,_std::shared_ptr<TCPConnection>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<TCPConnection>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[](local_38,&local_48.fd);
          peVar5 = (pmVar8->super___shared_ptr<TCPConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          this_00 = (pmVar8->super___shared_ptr<TCPConnection,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount._M_pi;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_00->_M_use_count = this_00->_M_use_count + 1;
            }
          }
          pthread_rwlock_unlock((pthread_rwlock_t *)this);
          uVar1 = peVar5->poll_flags_;
          if ((local_48.events & uVar1) != 0) {
            local_40[nVar11].revents = uVar1;
            iVar6 = iVar6 + 1;
          }
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
        }
        if (bVar12) {
          pthread_rwlock_unlock((pthread_rwlock_t *)this);
        }
        nVar11 = nVar11 + 1;
      } while (nVar11 != __nfds);
    }
    if (0 < iVar6) {
      return iVar6;
    }
  } while( true );
}

Assistant:

int TCPController::poll(struct pollfd *fds, nfds_t nfds, int timeout) {
    int total_polls = 0;
    while (true) {
        for (int i = 0; i < nfds; i++) {
            struct pollfd pfd = fds[i];
            std::shared_lock lock(mutex_);
            if (connections.find(pfd.fd) != connections.end()) {
//                std::cout << "query on fd " << pfd.fd << "for event " << pfd.events << std::endl;
                auto conn = connections[pfd.fd];
                lock.unlock();
//                short flags = 0;
//                if (conn->hasRead()) {
//                    flags |= (POLLRDNORM | POLLRDBAND | POLLIN | POLLPRI);
//                }
//                flags |= (POLLOUT | POLLWRNORM | POLLWRBAND);
                if ((conn->hasRead() & pfd.events) != 0) {
//                    std::cout << "return on fd " << pfd.fd << "for event " << conn->hasRead() << std::endl;
                    fds[i].revents = conn->hasRead();
                    total_polls++;
                }
            }
        }
        if (total_polls > 0) {
            break;
        }

    }
    return total_polls;
}